

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_filter.cpp
# Opt level: O1

void __thiscall
cppcms::http::content_limits::content_limits(content_limits *this,cached_settings *s)

{
  pointer pcVar1;
  
  this->content_length_limit_ = (s->security).content_length_limit << 10;
  this->file_in_memory_limit_ = (long)(s->security).file_in_memory_limit;
  this->multipart_form_data_limit_ = (s->security).multipart_form_data_limit << 10;
  (this->uploads_path_)._M_dataplus._M_p = (pointer)&(this->uploads_path_).field_2;
  pcVar1 = (s->security).uploads_path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->uploads_path_,pcVar1,
             pcVar1 + (s->security).uploads_path._M_string_length);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

content_limits::content_limits(impl::cached_settings const &s)  :
	content_length_limit_(s.security.content_length_limit * 1024LL),
	file_in_memory_limit_(s.security.file_in_memory_limit),
	multipart_form_data_limit_(s.security.multipart_form_data_limit * 1024LL),
	uploads_path_(s.security.uploads_path)
{
}